

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CIrrDeviceStub.cpp
# Opt level: O2

void __thiscall irr::CIrrDeviceStub::~CIrrDeviceStub(CIrrDeviceStub *this,void **vtt)

{
  _func_int **pp_Var1;
  long *plVar2;
  IContextManager *pIVar3;
  IFileSystem *pIVar4;
  ISceneManager *pIVar5;
  ICursorControl *pIVar6;
  IOSOperator *pIVar7;
  ITimer *pIVar8;
  bool bVar9;
  
  pp_Var1 = (_func_int **)*vtt;
  (this->super_IrrlichtDevice)._vptr_IrrlichtDevice = pp_Var1;
  *(void **)((long)&(this->super_IrrlichtDevice)._vptr_IrrlichtDevice + (long)pp_Var1[-3]) = vtt[3];
  plVar2 = *(long **)&(this->super_IrrlichtDevice).field_0x10;
  if (plVar2 != (long *)0x0) {
    IReferenceCounted::drop((IReferenceCounted *)((long)plVar2 + *(long *)(*plVar2 + -0x18)));
  }
  plVar2 = *(long **)&(this->super_IrrlichtDevice).field_0x18;
  if (plVar2 != (long *)0x0) {
    IReferenceCounted::drop((IReferenceCounted *)((long)plVar2 + *(long *)(*plVar2 + -0x18)));
  }
  plVar2 = *(long **)&(this->super_IrrlichtDevice).field_0x8;
  if (plVar2 != (long *)0x0) {
    IReferenceCounted::drop((IReferenceCounted *)((long)plVar2 + *(long *)(*plVar2 + -0x18)));
  }
  pIVar3 = this->ContextManager;
  if (pIVar3 != (IContextManager *)0x0) {
    IReferenceCounted::drop
              ((IReferenceCounted *)
               ((long)&pIVar3->_vptr_IContextManager + (long)pIVar3->_vptr_IContextManager[-3]));
  }
  pIVar4 = this->FileSystem;
  if (pIVar4 != (IFileSystem *)0x0) {
    IReferenceCounted::drop
              ((IReferenceCounted *)
               ((long)&pIVar4->_vptr_IFileSystem + (long)pIVar4->_vptr_IFileSystem[-3]));
  }
  pIVar5 = this->InputReceivingSceneManager;
  if (pIVar5 != (ISceneManager *)0x0) {
    IReferenceCounted::drop
              ((IReferenceCounted *)
               ((long)&pIVar5->_vptr_ISceneManager + (long)pIVar5->_vptr_ISceneManager[-3]));
  }
  pIVar6 = this->CursorControl;
  if (pIVar6 != (ICursorControl *)0x0) {
    IReferenceCounted::drop
              ((IReferenceCounted *)
               ((long)&pIVar6->_vptr_ICursorControl + (long)pIVar6->_vptr_ICursorControl[-3]));
  }
  pIVar7 = this->Operator;
  if (pIVar7 != (IOSOperator *)0x0) {
    IReferenceCounted::drop
              ((IReferenceCounted *)
               ((long)&pIVar7->_vptr_IOSOperator + (long)pIVar7->_vptr_IOSOperator[-3]));
  }
  this->CursorControl = (ICursorControl *)0x0;
  pIVar8 = this->Timer;
  if (pIVar8 != (ITimer *)0x0) {
    IReferenceCounted::drop
              ((IReferenceCounted *)((long)&pIVar8->_vptr_ITimer + (long)pIVar8->_vptr_ITimer[-3]));
  }
  bVar9 = IReferenceCounted::drop
                    ((IReferenceCounted *)
                     ((long)&(this->Logger->super_ILogger)._vptr_ILogger +
                     (long)(this->Logger->super_ILogger)._vptr_ILogger[-3]));
  if (bVar9) {
    os::Printer::Logger = 0;
  }
  ::std::__cxx11::string::_M_dispose();
  return;
}

Assistant:

CIrrDeviceStub::~CIrrDeviceStub()
{
	if (GUIEnvironment)
		GUIEnvironment->drop();

	if (SceneManager)
		SceneManager->drop();

	if (VideoDriver)
		VideoDriver->drop();

	if (ContextManager)
		ContextManager->drop();

	if (FileSystem)
		FileSystem->drop();

	if (InputReceivingSceneManager)
		InputReceivingSceneManager->drop();

	if (CursorControl)
		CursorControl->drop();

	if (Operator)
		Operator->drop();

	CursorControl = 0;

	if (Timer)
		Timer->drop();

	if (Logger->drop())
		os::Printer::Logger = 0;
}